

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

level_type booster::log::logger::string_to_level(string *l)

{
  int iVar1;
  level_type lVar2;
  invalid_argument *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  iVar1 = std::__cxx11::string::compare((char *)l);
  if (iVar1 == 0) {
    lVar2 = emergency;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)l);
    if (iVar1 == 0) {
      lVar2 = alert;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)l);
      if (iVar1 == 0) {
        lVar2 = critical;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)l);
        if (iVar1 == 0) {
          lVar2 = error;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)l);
          if (iVar1 == 0) {
            lVar2 = warning;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)l);
            if (iVar1 == 0) {
              lVar2 = notice;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)l);
              if (iVar1 == 0) {
                lVar2 = info;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)l);
                lVar2 = debug;
                if (iVar1 != 0) {
                  this = (invalid_argument *)__cxa_allocate_exception(0x30);
                  std::operator+(&bStack_38,"Invalig logging level :",l);
                  invalid_argument::invalid_argument(this,&bStack_38);
                  __cxa_throw(this,&invalid_argument::typeinfo,invalid_argument::~invalid_argument);
                }
              }
            }
          }
        }
      }
    }
  }
  return lVar2;
}

Assistant:

level_type logger::string_to_level(std::string const &l)
	{
		if(l=="emergency") return emergency;
		if(l=="alert") return alert;
		if(l=="critical") return critical;
		if(l=="error") return error;
		if(l=="warning") return warning;
		if(l=="notice") return notice;
		if(l=="info") return info;
		if(l=="debug") return debug;
		throw booster::invalid_argument("Invalig logging level :" + l);
	}